

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O1

void __thiscall
QPDF::writeJSON(QPDF *this,int version,Pipeline *p,bool complete,bool *first_key,
               qpdf_stream_decode_level_e decode_level,qpdf_json_stream_data_e json_stream_data,
               string *file_prefix,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               wanted_objects)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *__v;
  char cVar2;
  bool bVar3;
  __index_type _Var4;
  size_t __val;
  long *plVar5;
  const_iterator cVar6;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar7;
  runtime_error *this_00;
  undefined7 in_register_00000009;
  size_t sVar8;
  size_type *psVar9;
  pointer this_01;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  Writer jw;
  string __str;
  string __str_1;
  string local_a0;
  qpdf_stream_decode_level_e local_7c;
  long local_78;
  undefined4 local_6c;
  QPDFObjGen og;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_48;
  
  local_7c = decode_level;
  if (version != 2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"QPDF::writeJSON: only version 2 is supported");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  jw.first = true;
  jw.indent = 8;
  jw.p = p;
  if (complete) {
    pcVar11 = "{";
  }
  else {
    if (*first_key != false) goto LAB_0021242b;
    pcVar11 = ",";
  }
  (*p->_vptr_Pipeline[2])(p,pcVar11,1);
LAB_0021242b:
  *first_key = false;
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n  \"qpdf\": [\n    {\n      \"jsonversion\": ",0x28);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,'\x01');
  *__str._M_dataplus._M_p = '2';
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,__str._M_dataplus._M_p,__str._M_string_length);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,",\n      \"pdfversion\": \"",0x17);
  getPDFVersion_abi_cxx11_(&local_a0,this);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\",\n      \"pushedinheritedpageresources\": ",0x29);
  bVar3 = everPushedInheritedAttributesToPages(this);
  pcVar11 = "false";
  pcVar12 = "false";
  if (bVar3) {
    pcVar12 = "true";
  }
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,pcVar12,(ulong)bVar3 ^ 5);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,",\n      \"calledgetallpages\": ",0x1d);
  bVar3 = everCalledGetAllPages(this);
  if (bVar3) {
    pcVar11 = "true";
  }
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,pcVar11,(ulong)bVar3 ^ 5);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,",\n      \"maxobjectid\": ",0x17);
  __val = getObjectCount(this);
  cVar10 = '\x01';
  if (9 < __val) {
    sVar8 = __val;
    cVar2 = '\x04';
    do {
      cVar10 = cVar2;
      if (sVar8 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_002125b4;
      }
      if (sVar8 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_002125b4;
      }
      if (sVar8 < 10000) goto LAB_002125b4;
      bVar3 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar2 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_002125b4:
  __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str_1,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,__val);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,__str_1._M_dataplus._M_p,__str_1._M_string_length);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n    },\n    {",0xd);
  local_6c = (undefined4)CONCAT71(in_register_00000009,complete);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  local_78 = *(long *)(wanted_objects._M_t._M_impl._0_8_ + 0x28);
  getAllObjects(&local_48,this);
  bVar3 = true;
  if (local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = true;
    this_01 = local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      og = QPDFObjectHandle::getObjGen(this_01);
      QPDFObjGen::unparse_abi_cxx11_(&__str_1,&og,' ');
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x268899);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0.field_2._8_8_ = plVar5[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_a0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        __str.field_2._M_allocated_capacity = *psVar9;
        __str.field_2._8_8_ = plVar5[3];
      }
      else {
        __str.field_2._M_allocated_capacity = *psVar9;
        __str._M_dataplus._M_p = (pointer)*plVar5;
      }
      __str._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      if ((local_78 == 0) ||
         (cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)wanted_objects._M_t._M_impl._0_8_,&__str),
         cVar6._M_node != (_Base_ptr)(wanted_objects._M_t._M_impl._0_8_ + 8))) {
        if (bVar3) {
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      \"",8);
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,__str._M_dataplus._M_p,__str._M_string_length);
          bVar3 = false;
        }
        else {
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      },\n      \"",0x11);
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,__str._M_dataplus._M_p,__str._M_string_length);
        }
        __v = (this_01->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (__v == (element_type *)0x0) {
          _Var4 = '\0';
        }
        else {
          _Var4 = (__v->value).
                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  ._M_index;
          if (_Var4 == '\x0f') {
            pvVar7 = std::
                     get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                               (&__v->value);
          }
          else {
            if (_Var4 != '\r') goto LAB_00212894;
            pvVar7 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                      *)resolve(__v->qpdf,*(QPDFObjGen *)&(__v->og).obj);
          }
          _Var4 = (((pvVar7->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->value).
                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  ._M_index;
        }
LAB_00212894:
        if (_Var4 == '\n') {
          __str_1._M_dataplus._M_p =
               (pointer)(this_01->super_BaseHandle).obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          __str_1._M_string_length =
               (size_type)
               (this_01->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str_1._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str_1._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             __str_1._M_string_length)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str_1._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             __str_1._M_string_length)->_M_use_count + 1;
            }
          }
        }
        else {
          __str_1._M_dataplus._M_p = (pointer)0x0;
          __str_1._M_string_length = 0;
        }
        if (__str_1._M_dataplus._M_p == (pointer)0x0) {
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\": {\n        \"value\": ",0x16);
          QPDFObjectHandle::writeJSON(this_01,2,&jw,true);
        }
        else {
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\": {\n        \"stream\": ",0x17);
          if (json_stream_data == qpdf_sj_file) {
            writeJSONStreamFile(2,&jw,(Stream *)&__str_1,og.obj,local_7c,file_prefix);
          }
          else {
            local_a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
            ::qpdf::Stream::writeStreamJSON
                      ((Stream *)&__str_1,2,&jw,json_stream_data,local_7c,(Pipeline *)0x0,&local_a0,
                       false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if (__str_1._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str_1._M_string_length);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      this_01 = this_01 + 1;
    } while (this_01 !=
             local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
  bVar13 = true;
  if (local_78 != 0) {
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"trailer","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)wanted_objects._M_t._M_impl._0_8_,&__str);
    bVar13 = cVar6._M_node != (_Base_ptr)(wanted_objects._M_t._M_impl._0_8_ + 8);
  }
  if ((local_78 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2)) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if (bVar13) {
    if (!bVar3) {
      (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      },",9);
    }
    (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      \"trailer\": {\n        \"value\": ",0x25);
    getTrailer(this);
    QPDFObjectHandle::writeJSON((QPDFObjectHandle *)&local_a0,2,&jw,true);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
    }
    bVar3 = false;
  }
  if (!bVar3) {
    (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      }",8);
  }
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n    }\n  ]",10);
  if ((char)local_6c != '\0') {
    (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n}\n",3);
    (*p->_vptr_Pipeline[3])(p);
  }
  return;
}

Assistant:

void
QPDF::writeJSON(
    int version,
    Pipeline* p,
    bool complete,
    bool& first_key,
    qpdf_stream_decode_level_e decode_level,
    qpdf_json_stream_data_e json_stream_data,
    std::string const& file_prefix,
    std::set<std::string> wanted_objects)
{
    if (version != 2) {
        throw std::runtime_error("QPDF::writeJSON: only version 2 is supported");
    }
    JSON::Writer jw{p, 4};
    if (complete) {
        jw << "{";
    } else if (!first_key) {
        jw << ",";
    }
    first_key = false;

    /* clang-format off */
    jw << "\n"
          "  \"qpdf\": [\n"
          "    {\n"
          "      \"jsonversion\": " << std::to_string(version) << ",\n"
          "      \"pdfversion\": \"" << getPDFVersion() << "\",\n"
          "      \"pushedinheritedpageresources\": " <<  (everPushedInheritedAttributesToPages() ? "true" : "false") << ",\n"
          "      \"calledgetallpages\": " <<  (everCalledGetAllPages() ? "true" : "false") << ",\n"
          "      \"maxobjectid\": " <<  std::to_string(getObjectCount()) << "\n"
          "    },\n"
          "    {";
    /* clang-format on */

    bool all_objects = wanted_objects.empty();
    bool first = true;
    for (auto& obj: getAllObjects()) {
        auto const og = obj.getObjGen();
        std::string key = "obj:" + og.unparse(' ') + " R";
        if (all_objects || wanted_objects.count(key)) {
            if (first) {
                jw << "\n      \"" << key;
                first = false;
            } else {
                jw << "\n      },\n      \"" << key;
            }
            if (auto stream = obj.as_stream()) {
                jw << "\": {\n        \"stream\": ";
                if (json_stream_data == qpdf_sj_file) {
                    writeJSONStreamFile(
                        version, jw, stream, og.getObj(), decode_level, file_prefix);
                } else {
                    stream.writeStreamJSON(
                        version, jw, json_stream_data, decode_level, nullptr, "");
                }
            } else {
                jw << "\": {\n        \"value\": ";
                obj.writeJSON(version, jw, true);
            }
        }
    }
    if (all_objects || wanted_objects.count("trailer")) {
        if (!first) {
            jw << "\n      },";
        }
        jw << "\n      \"trailer\": {\n        \"value\": ";
        getTrailer().writeJSON(version, jw, true);
        first = false;
    }
    if (!first) {
        jw << "\n      }";
    }
    /* clang-format off */
    jw << "\n"
          "    }\n"
          "  ]";
    /* clang-format on */
    if (complete) {
        jw << "\n}\n";
        p->finish();
    }
}